

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

string * __thiscall
libaom_examples::(anonymous_namespace)::format_depth_representation_element_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          pair<libaom_examples::DepthRepresentationElement,_bool> *element)

{
  double __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this[8] == (_anonymous_namespace_)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"absent",(allocator *)&bStack_1b8)
    ;
  }
  else {
    __val = depth_representation_element_to_double((DepthRepresentationElement *)this);
    std::__cxx11::to_string(&local_38,__val);
    std::operator+(&local_118,&local_38," (sign ");
    std::__cxx11::to_string(&local_138,(uint)(byte)*this);
    std::operator+(&local_f8,&local_118,&local_138);
    std::operator+(&local_d8,&local_f8," exponent ");
    std::__cxx11::to_string(&local_158,(uint)(byte)this[1]);
    std::operator+(&local_b8,&local_d8,&local_158);
    std::operator+(&local_98,&local_b8," mantissa ");
    std::__cxx11::to_string(&local_178,*(uint *)(this + 4));
    std::operator+(&local_78,&local_98,&local_178);
    std::operator+(&local_58,&local_78," mantissa_len ");
    std::__cxx11::to_string(&local_198,(uint)(byte)this[2]);
    std::operator+(&bStack_1b8,&local_58,&local_198);
    std::operator+(__return_storage_ptr__,&bStack_1b8,")");
    std::__cxx11::string::~string((string *)&bStack_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_depth_representation_element(
    const std::pair<DepthRepresentationElement, bool> &element) {
  if (!element.second) {
    return "absent";
  } else {
    return std::to_string(
               depth_representation_element_to_double(element.first)) +
           " (sign " + std::to_string(element.first.sign_flag) + " exponent " +
           std::to_string(element.first.exponent) + " mantissa " +
           std::to_string(element.first.mantissa) + " mantissa_len " +
           std::to_string(element.first.mantissa_len) + ")";
  }
}